

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_copy_stat.c
# Opt level: O0

void archive_entry_copy_stat(archive_entry *entry,stat *st)

{
  dev_t *in_RSI;
  archive_entry *in_RDI;
  
  archive_entry_set_atime(in_RDI,in_RSI[9],in_RSI[10]);
  archive_entry_set_ctime(in_RDI,in_RSI[0xd],in_RSI[0xe]);
  archive_entry_set_mtime(in_RDI,in_RSI[0xb],in_RSI[0xc]);
  archive_entry_unset_birthtime((archive_entry *)0x19f4fc);
  archive_entry_set_dev(in_RDI,*in_RSI);
  archive_entry_set_gid(in_RDI,(ulong)(uint)in_RSI[4]);
  archive_entry_set_uid(in_RDI,(ulong)*(uint *)((long)in_RSI + 0x1c));
  archive_entry_set_ino(in_RDI,in_RSI[1]);
  archive_entry_set_nlink(in_RDI,(uint)in_RSI[2]);
  archive_entry_set_rdev(in_RDI,in_RSI[5]);
  archive_entry_set_size(in_RDI,in_RSI[6]);
  archive_entry_set_mode(in_RDI,(mode_t)in_RSI[3]);
  return;
}

Assistant:

void
archive_entry_copy_stat(struct archive_entry *entry, const struct stat *st)
{
#if HAVE_STRUCT_STAT_ST_MTIMESPEC_TV_NSEC
	archive_entry_set_atime(entry, st->st_atime, st->st_atimespec.tv_nsec);
	archive_entry_set_ctime(entry, st->st_ctime, st->st_ctimespec.tv_nsec);
	archive_entry_set_mtime(entry, st->st_mtime, st->st_mtimespec.tv_nsec);
#elif HAVE_STRUCT_STAT_ST_MTIM_TV_NSEC
	archive_entry_set_atime(entry, st->st_atime, st->st_atim.tv_nsec);
	archive_entry_set_ctime(entry, st->st_ctime, st->st_ctim.tv_nsec);
	archive_entry_set_mtime(entry, st->st_mtime, st->st_mtim.tv_nsec);
#elif HAVE_STRUCT_STAT_ST_MTIME_N
	archive_entry_set_atime(entry, st->st_atime, st->st_atime_n);
	archive_entry_set_ctime(entry, st->st_ctime, st->st_ctime_n);
	archive_entry_set_mtime(entry, st->st_mtime, st->st_mtime_n);
#elif HAVE_STRUCT_STAT_ST_UMTIME
	archive_entry_set_atime(entry, st->st_atime, st->st_uatime * 1000);
	archive_entry_set_ctime(entry, st->st_ctime, st->st_uctime * 1000);
	archive_entry_set_mtime(entry, st->st_mtime, st->st_umtime * 1000);
#elif HAVE_STRUCT_STAT_ST_MTIME_USEC
	archive_entry_set_atime(entry, st->st_atime, st->st_atime_usec * 1000);
	archive_entry_set_ctime(entry, st->st_ctime, st->st_ctime_usec * 1000);
	archive_entry_set_mtime(entry, st->st_mtime, st->st_mtime_usec * 1000);
#else
	archive_entry_set_atime(entry, st->st_atime, 0);
	archive_entry_set_ctime(entry, st->st_ctime, 0);
	archive_entry_set_mtime(entry, st->st_mtime, 0);
#endif
#if HAVE_STRUCT_STAT_ST_BIRTHTIMESPEC_TV_NSEC
	archive_entry_set_birthtime(entry, st->st_birthtime, st->st_birthtimespec.tv_nsec);
#elif HAVE_STRUCT_STAT_ST_BIRTHTIME
	archive_entry_set_birthtime(entry, st->st_birthtime, 0);
#else
	archive_entry_unset_birthtime(entry);
#endif
	archive_entry_set_dev(entry, st->st_dev);
	archive_entry_set_gid(entry, st->st_gid);
	archive_entry_set_uid(entry, st->st_uid);
	archive_entry_set_ino(entry, st->st_ino);
	archive_entry_set_nlink(entry, st->st_nlink);
	archive_entry_set_rdev(entry, st->st_rdev);
	archive_entry_set_size(entry, st->st_size);
	archive_entry_set_mode(entry, st->st_mode);
}